

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_tests.cc
# Opt level: O0

void __thiscall
lf::io::test::lf_io_gmsh_file_v4_readPieceOfCake_Test::~lf_io_gmsh_file_v4_readPieceOfCake_Test
          (lf_io_gmsh_file_v4_readPieceOfCake_Test *this)

{
  lf_io_gmsh_file_v4_readPieceOfCake_Test *this_local;
  
  ~lf_io_gmsh_file_v4_readPieceOfCake_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_io_gmsh_file_v4, readPieceOfCake) {
  auto filename = test_utils::getMeshPath("piece_of_cake.msh");
  auto mshfile = ReadGmshFile(filename);
  EXPECT_TRUE(std::holds_alternative<GMshFileV4>(mshfile));
  auto filev4 = std::get<GMshFileV4>(mshfile);
  EXPECT_FALSE(filev4.is_binary);
  checkPieceOfCake(filev4);
}